

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O0

void Ndr_NtkPrintNodes(Wlc_Ntk_t *pNtk)

{
  int iVar1;
  uint uVar2;
  Wlc_Obj_t *p;
  int *piVar3;
  int *pFanins;
  int k;
  int i;
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *pNtk_local;
  
  printf("Node IDs and their fanins:\n");
  for (pFanins._4_4_ = 1; iVar1 = Wlc_NtkObjNumMax(pNtk), (int)pFanins._4_4_ < iVar1;
      pFanins._4_4_ = pFanins._4_4_ + 1) {
    p = Wlc_NtkObj(pNtk,pFanins._4_4_);
    piVar3 = Wlc_ObjFanins(p);
    printf("%5d = ",(ulong)pFanins._4_4_);
    for (pFanins._0_4_ = 0; iVar1 = Wlc_ObjFaninNum(p), (int)pFanins < iVar1;
        pFanins._0_4_ = (int)pFanins + 1) {
      printf("%5d ",(ulong)(uint)piVar3[(int)pFanins]);
    }
    for (; (int)pFanins < 4; pFanins._0_4_ = (int)pFanins + 1) {
      printf("      ");
    }
    uVar2 = Wlc_ObjNameId(pNtk,pFanins._4_4_);
    printf("    Name Id %d ",(ulong)uVar2);
    iVar1 = Wlc_ObjIsPi(p);
    if (iVar1 != 0) {
      printf("  pi  ");
    }
    iVar1 = Wlc_ObjIsPo(p);
    if (iVar1 != 0) {
      printf("  po  ");
    }
    printf("\n");
  }
  return;
}

Assistant:

void Ndr_NtkPrintNodes( Wlc_Ntk_t * pNtk )
{
    Wlc_Obj_t * pObj; int i, k;
    printf( "Node IDs and their fanins:\n" );
    Wlc_NtkForEachObj( pNtk, pObj, i )
    {
        int * pFanins = Wlc_ObjFanins(pObj);
        printf( "%5d = ", i );
        for ( k = 0; k < Wlc_ObjFaninNum(pObj); k++ )
            printf( "%5d ", pFanins[k] );
        for (      ; k < 4; k++ )
            printf( "      " );
        printf( "    Name Id %d ", Wlc_ObjNameId(pNtk, i) );
        if ( Wlc_ObjIsPi(pObj) )
            printf( "  pi  " );
        if ( Wlc_ObjIsPo(pObj) )
            printf( "  po  " );
        printf( "\n" );
    }
}